

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_artifact_name(parser *p)

{
  char *pcVar1;
  void *pvVar2;
  undefined8 *v;
  artifact *a;
  artifact *h;
  char *name;
  size_t i;
  parser *p_local;
  
  pcVar1 = parser_getstr(p,"name");
  pvVar2 = parser_priv(p);
  v = (undefined8 *)mem_zalloc(0x140);
  v[3] = pvVar2;
  parser_setpriv(p,v);
  pcVar1 = string_make(pcVar1);
  *v = pcVar1;
  for (name = (char *)0x0; name < (char *)0x4; name = name + 1) {
    *(byte *)((long)v + (long)name * 4 + 0x92) = *(byte *)((long)v + (long)name * 4 + 0x92) | 2;
  }
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_artifact_name(struct parser *p) {
	size_t i;
	const char *name = parser_getstr(p, "name");
	struct artifact *h = parser_priv(p);

	struct artifact *a = mem_zalloc(sizeof *a);
	a->next = h;
	parser_setpriv(p, a);
	a->name = string_make(name);

	/* Ignore all base elements */
	for (i = ELEM_BASE_MIN; i < ELEM_HIGH_MIN; i++) {
		a->el_info[i].flags |= EL_INFO_IGNORE;
	}

	return PARSE_ERROR_NONE;
}